

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O0

void anon_unknown.dwarf_4210c::testRandomAngles
               (_func_M44f_M44f_ptr_Order *matrixEulerMatrix,Order order)

{
  float *pfVar1;
  double dVar2;
  int k;
  int j;
  M44f M;
  Eulerf e;
  int i;
  Rand48 r;
  unsigned_long in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  Euler<float> *in_stack_ffffffffffffff60;
  int local_70;
  int local_6c;
  float in_stack_ffffffffffffffd4;
  _func_M44f_M44f_ptr_Order *in_stack_ffffffffffffffd8;
  M44f *in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffec;
  
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  for (iVar3 = 0; iVar3 < 100000; iVar3 = iVar3 + 1) {
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (double)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    in_stack_ffffffffffffff4c = rad((float)dVar2);
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (double)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    in_stack_ffffffffffffff48 = rad((float)dVar2);
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (double)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    rad((float)dVar2);
    Imath_3_2::Euler<float>::Euler
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff54,(Order)in_stack_ffffffffffffff50,
               (InputLayout)in_stack_ffffffffffffff4c);
    Imath_3_2::Euler<float>::toMatrix44((Euler<float> *)CONCAT44(in_stack_ffffffffffffffec,iVar3));
    for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < 3; local_70 = local_70 + 1) {
        dVar2 = Imath_3_2::Rand48::nextf
                          ((Rand48 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                           (double)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        in_stack_ffffffffffffff44 = (float)dVar2;
        pfVar1 = Imath_3_2::Matrix44<float>::operator[]
                           ((Matrix44<float> *)&stack0xffffffffffffff98,local_6c);
        pfVar1[local_70] = in_stack_ffffffffffffff44 + pfVar1[local_70];
      }
    }
    Imath_3_2::Matrix44<float>::Matrix44
              ((Matrix44<float> *)&stack0xffffffffffffff50,
               (Matrix44<float> *)&stack0xffffffffffffff98);
    testMatrix(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(Order)in_stack_ffffffffffffffd4)
    ;
  }
  return;
}

Assistant:

void
testRandomAngles (
    M44f (*matrixEulerMatrix) (const M44f&, Eulerf::Order), Eulerf::Order order)
{
    Rand48 r (0);

    for (int i = 0; i < 100000; ++i)
    {
        //
        // Create a rotation matrix, M
        //

        Eulerf e (
            rad (float(r.nextf (-180, 180))),
            rad (float(r.nextf (-180, 180))),
            rad (float(r.nextf (-180, 180))),
            Eulerf::XYZ);

        M44f M (e.toMatrix44 ());

        //
        // Add a small random error to the elements of M
        //

        for (int j = 0; j < 3; ++j)
            for (int k = 0; k < 3; ++k)
                M[j][k] += float(r.nextf (-1e-7, 1e-7));

        //
        // Extract Euler angles from M, convert the Euler angles
        // back to a matrix, N, and verify that the entries in M
        // and N do not differ too much.
        //

        testMatrix (M, matrixEulerMatrix, order);
    }
}